

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int GetDesiredMillisecondsPerFrame(void)

{
  code *pcVar1;
  SDL_AssertState SVar2;
  int iVar3;
  undefined1 local_28 [4];
  SDL_AssertState sdl_assert_state;
  SDL_DisplayMode mode;
  
  if ((VideoSurface12->flags & 0x80000000) == 0) {
    iVar3 = (*SDL20_GetCurrentDisplayMode)(VideoDisplayIndex,(SDL_DisplayMode *)local_28);
    if ((iVar3 == 0) && (mode.w != 0)) {
      return (int)(1000 / (long)mode.w);
    }
  }
  else {
    do {
      if (VideoWindow20 != (SDL_Window *)0x0) goto LAB_0012301c;
      SVar2 = (*SDL20_ReportAssertion)
                        (&GetDesiredMillisecondsPerFrame::sdl_assert_data,
                         "GetDesiredMillisecondsPerFrame",
                         "/workspace/llm4binary/github/license_c_cmakelists/libsdl-org[P]sdl12-compat/src/SDL12_compat.c"
                         ,0x1bab);
    } while (SVar2 == SDL_ASSERTION_RETRY);
    if (SVar2 == SDL_ASSERTION_BREAK) {
      pcVar1 = (code *)swi(3);
      iVar3 = (*pcVar1)();
      return iVar3;
    }
LAB_0012301c:
    iVar3 = (*SDL20_GetWindowDisplayMode)(VideoWindow20,(SDL_DisplayMode *)local_28);
    if ((iVar3 == 0) && (mode.w != 0)) {
      return (int)(1000 / (long)mode.w);
    }
  }
  return 0xf;
}

Assistant:

static int
GetDesiredMillisecondsPerFrame()
{
    SDL_DisplayMode mode;
    if (VideoSurface12->flags & SDL12_FULLSCREEN) {
       SDL_assert(VideoWindow20 != NULL);
       if (SDL20_GetWindowDisplayMode(VideoWindow20, &mode) == 0) {
           if (mode.refresh_rate) {
               return 1000 / mode.refresh_rate;
           }
       }
    } else if (SDL20_GetCurrentDisplayMode(VideoDisplayIndex, &mode) == 0) {
        /* If we're windowed, assume we're on the default screen. */
        if (mode.refresh_rate) {
            return 1000 / mode.refresh_rate;
        }
    }
    return 15;
}